

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int do_zlib(zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  int iVar1;
  int parse_header_local;
  int exp_local;
  int olen_local;
  char *obuf_local;
  zbuf *a_local;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  iVar1 = parse_zlib(a,parse_header);
  return iVar1;
}

Assistant:

static int do_zlib(zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return parse_zlib(a, parse_header);
}